

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

int mixed_buffer_from_pack(mixed_pack *in,mixed_buffer **outs,float *volume,float target_volume)

{
  mixed_encoding encoding;
  mixed_buffer *pmVar1;
  mixed_transfer_function_from p_Var2;
  float *pfVar3;
  long lVar4;
  mixed_buffer **ppmVar5;
  mixed_pack *pmVar6;
  float fVar7;
  void *pvVar8;
  float fVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  uint32_t uVar13;
  uint uVar14;
  ulong uVar15;
  char cVar16;
  ulong uVar17;
  float *pfStack_80;
  float ****local_78;
  ulong local_70;
  float *local_68;
  mixed_buffer **local_60;
  mixed_pack *local_58;
  float local_4c;
  void *local_48;
  char *ind;
  uint local_38;
  uint32_t local_34 [2];
  uint32_t frames;
  
  bVar11 = in->channels;
  pfStack_80 = (float *)0x12d11b;
  local_68 = volume;
  local_60 = outs;
  ind._4_4_ = target_volume;
  bVar10 = mixed_samplesize(in->encoding);
  uVar14 = (uint)bVar10 * (uint)bVar11;
  local_34[0] = 0xffffffff;
  lVar4 = -(ulong)((uint)bVar11 * 8 + 0xf & 0xfffffff0);
  local_78 = (float ****)&local_78;
  local_58 = in;
  *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d159;
  mixed_pack_request_read(&local_48,local_34,in);
  ppmVar5 = local_60;
  local_34[0] = local_34[0] / uVar14;
  local_70 = (ulong)bVar11;
  local_38 = uVar14;
  if (bVar11 != 0) {
    uVar15 = 0;
    do {
      pmVar1 = *(mixed_buffer **)((long)ppmVar5 + uVar15);
      *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d191;
      mixed_buffer_request_write
                ((float **)((long)&local_78 + uVar15 + lVar4 + -0x78 + 0x78),local_34,pmVar1);
      uVar15 = uVar15 + 8;
    } while ((uint)bVar11 * 8 != uVar15);
  }
  pmVar6 = local_58;
  uVar15 = local_70;
  iVar12 = (int)local_70;
  if (local_34[0] != 0) {
    encoding = local_58->encoding;
    *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d1b7;
    bVar11 = mixed_samplesize(encoding);
    p_Var2 = transfer_array_functions_from[encoding - MIXED_INT8];
    local_4c = *local_68;
    *local_68 = ind._4_4_;
    if (uVar15 == 0) {
      uVar13 = local_38 * local_34[0];
      *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d25c;
      mixed_pack_finish_read(uVar13,pmVar6);
      return 1;
    }
    cVar16 = '\0';
    do {
      uVar13 = local_34[0];
      fVar9 = ind._4_4_;
      pvVar8 = local_48;
      fVar7 = local_4c;
      pfVar3 = *(float **)((long)&local_78 + (long)cVar16 * 8 + lVar4 + -0x78 + 0x78);
      *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d1fd;
      (*p_Var2)(pvVar8,pfVar3,(uint8_t)uVar15,uVar13,fVar7,fVar9);
      local_48 = (void *)((long)local_48 + (ulong)bVar11);
      cVar16 = cVar16 + '\x01';
    } while (cVar16 < iVar12);
  }
  pmVar6 = local_58;
  uVar13 = local_38 * local_34[0];
  *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d228;
  mixed_pack_finish_read(uVar13,pmVar6);
  ppmVar5 = local_60;
  if (uVar15 != 0) {
    uVar17 = 0;
    do {
      uVar13 = local_34[0];
      pmVar1 = ppmVar5[uVar17];
      *(undefined8 *)((long)&pfStack_80 + lVar4) = 0x12d243;
      mixed_buffer_finish_write(uVar13,pmVar1);
      uVar17 = uVar17 + 1;
    } while ((uVar15 & 0xffffffff) != uVar17);
  }
  return 1;
}

Assistant:

int mixed_buffer_from_pack(struct mixed_pack *in, struct mixed_buffer **outs, float *volume, float target_volume){
  mixed_channel_t channels = in->channels;
  uint32_t frames_to_bytes = channels * mixed_samplesize(in->encoding);
  uint32_t frames = UINT32_MAX;
  char *ind;
  float *outd[channels];

  mixed_pack_request_read((void**)&ind, &frames, in);
  frames = frames / frames_to_bytes;
  for(uint32_t i=0; i<channels; ++i)
    mixed_buffer_request_write(&outd[i], &frames, outs[i]);

  if(0 < frames){
    mixed_transfer_function_from fun = transfer_array_functions_from[in->encoding-1];
    uint8_t size = mixed_samplesize(in->encoding);
    float vol = *volume;
    // KLUDGE: this is not necessarily correct...
    *volume = target_volume;
    for(int8_t c=0; c<channels; ++c){
      fun(ind, outd[c], channels, frames, vol, target_volume);
      ind += size;
    }
  }

  mixed_pack_finish_read(frames * frames_to_bytes, in);
  for(uint32_t i=0; i<channels; ++i)
    mixed_buffer_finish_write(frames, outs[i]);
  
  return 1;
}